

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cc
# Opt level: O2

void __thiscall avro::Name::Name(Name *this,string *name)

{
  (this->ns_)._M_dataplus._M_p = (pointer)&(this->ns_).field_2;
  (this->ns_)._M_string_length = 0;
  (this->ns_).field_2._M_local_buf[0] = '\0';
  (this->simpleName_)._M_dataplus._M_p = (pointer)&(this->simpleName_).field_2;
  (this->simpleName_)._M_string_length = 0;
  (this->simpleName_).field_2._M_local_buf[0] = '\0';
  fullname(this,name);
  return;
}

Assistant:

Name::Name(const std::string& name)
{
    fullname(name);
}